

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::find_child_by_attribute(xml_node *this,char_t *attr_name,char_t *attr_value)

{
  bool bVar1;
  char *local_50;
  char_t *local_38;
  xml_attribute_struct *a;
  xml_node_struct *i;
  char_t *attr_value_local;
  char_t *attr_name_local;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    xml_node((xml_node *)&this_local);
  }
  else {
    for (a = (xml_attribute_struct *)this->_root->first_child; a != (xml_attribute_struct *)0x0;
        a = (xml_attribute_struct *)a[1].name) {
      for (local_38 = a[1].value; local_38 != (char_t *)0x0;
          local_38 = *(char_t **)(local_38 + 0x20)) {
        if ((*(long *)(local_38 + 8) != 0) &&
           (bVar1 = impl::anon_unknown_0::strequal(attr_name,*(char_t **)(local_38 + 8)), bVar1)) {
          if (*(long *)(local_38 + 0x10) == 0) {
            local_50 = "";
          }
          else {
            local_50 = *(char **)(local_38 + 0x10);
          }
          bVar1 = impl::anon_unknown_0::strequal(attr_value,local_50);
          if (bVar1) {
            xml_node((xml_node *)&this_local,(xml_node_struct *)a);
            return (xml_node)(xml_node_struct *)this_local;
          }
        }
      }
    }
    xml_node((xml_node *)&this_local);
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
				if (a->name && impl::strequal(attr_name, a->name) && impl::strequal(attr_value, a->value ? a->value + 0 : PUGIXML_TEXT("")))
					return xml_node(i);

		return xml_node();
	}